

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

ImGuiTableSettings * ImGui::TableGetBoundSettings(ImGuiTable *table)

{
  ImGuiTableSettings *pIVar1;
  
  if (table->SettingsOffset != -1) {
    pIVar1 = ImChunkStream<ImGuiTableSettings>::ptr_from_offset
                       (&GImGui->SettingsTables,table->SettingsOffset);
    if (pIVar1->ID != table->ID) {
      __assert_fail("settings->ID == table->ID",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                    ,0xc6f,"ImGuiTableSettings *ImGui::TableGetBoundSettings(ImGuiTable *)");
    }
    if (table->ColumnsCount <= (int)pIVar1->ColumnsCountMax) {
      return pIVar1;
    }
    pIVar1->ID = 0;
  }
  return (ImGuiTableSettings *)0x0;
}

Assistant:

ImGuiTableSettings* ImGui::TableGetBoundSettings(ImGuiTable* table)
{
    if (table->SettingsOffset != -1)
    {
        ImGuiContext& g = *GImGui;
        ImGuiTableSettings* settings = g.SettingsTables.ptr_from_offset(table->SettingsOffset);
        IM_ASSERT(settings->ID == table->ID);
        if (settings->ColumnsCountMax >= table->ColumnsCount)
            return settings; // OK
        settings->ID = 0; // Invalidate storage, we won't fit because of a count change
    }
    return NULL;
}